

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

CURLcode cf_h2_proxy_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  long *plVar1;
  undefined8 uVar2;
  timediff_t tVar3;
  _Bool local_59;
  tunnel_stream *ts;
  timediff_t check;
  cf_call_data save;
  CURLcode result;
  cf_h2_proxy_ctx *ctx;
  _Bool *done_local;
  _Bool blocking_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  plVar1 = (long *)cf->ctx;
  if ((cf->field_0x24 & 1) == 0) {
    if (((cf->next->field_0x24 & 1) != 0) ||
       ((cf_local._4_4_ = Curl_conn_cf_connect(cf->next,data,blocking,done),
        cf_local._4_4_ == CURLE_OK && ((*done & 1U) != 0)))) {
      *done = false;
      uVar2 = *(undefined8 *)((long)cf->ctx + 8);
      *(Curl_easy **)((long)cf->ctx + 8) = data;
      if ((*plVar1 != 0) ||
         (save.data._4_4_ = cf_h2_proxy_ctx_init(cf,data), save.data._4_4_ == CURLE_OK)) {
        tVar3 = Curl_timeleft(data,(curltime *)0x0,true);
        if (tVar3 < 1) {
          Curl_failf(data,"Proxy CONNECT aborted due to timeout");
          save.data._4_4_ = CURLE_OPERATION_TIMEDOUT;
        }
        else {
          save.data._4_4_ = H2_CONNECT(cf,data,(tunnel_stream *)(plVar1 + 0x12));
        }
      }
      local_59 = false;
      if (save.data._4_4_ == CURLE_OK) {
        local_59 = (int)plVar1[0x26] == 3;
      }
      *done = local_59;
      cf->field_0x24 = cf->field_0x24 & 0xfe | *done & 1U;
      *(undefined8 *)((long)cf->ctx + 8) = uVar2;
      cf_local._4_4_ = save.data._4_4_;
    }
  }
  else {
    *done = true;
    cf_local._4_4_ = CURLE_OK;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode cf_h2_proxy_connect(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool blocking, bool *done)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;
  struct cf_call_data save;
  timediff_t check;
  struct tunnel_stream *ts = &ctx->tunnel;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* Connect the lower filters first */
  if(!cf->next->connected) {
    result = Curl_conn_cf_connect(cf->next, data, blocking, done);
    if(result || !*done)
      return result;
  }

  *done = FALSE;

  CF_DATA_SAVE(save, cf, data);
  if(!ctx->h2) {
    result = cf_h2_proxy_ctx_init(cf, data);
    if(result)
      goto out;
  }
  DEBUGASSERT(ts->authority);

  check = Curl_timeleft(data, NULL, TRUE);
  if(check <= 0) {
    failf(data, "Proxy CONNECT aborted due to timeout");
    result = CURLE_OPERATION_TIMEDOUT;
    goto out;
  }

  /* for the secondary socket (FTP), use the "connect to host"
   * but ignore the "connect to port" (use the secondary port)
   */
  result = H2_CONNECT(cf, data, ts);

out:
  *done = (result == CURLE_OK) && (ts->state == H2_TUNNEL_ESTABLISHED);
  cf->connected = *done;
  CF_DATA_RESTORE(cf, save);
  return result;
}